

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O0

void drawMap(void)

{
  char *local_20;
  char *c;
  int local_10;
  int n;
  int y;
  int x;
  
  for (n = 0; n < 0x20; n = n + 1) {
    for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
      c._4_4_ = 0;
      if ((((-1 < n + map_view_x) && (n + map_view_x < 0x50)) && (-1 < local_10 + map_view_y)) &&
         (local_10 + map_view_y < 0x20)) {
        c._4_4_ = map_buffer[n + map_view_x + (local_10 + map_view_y) * 0x50];
      }
      drawChar(n << 2,local_10 * 6,c._4_4_);
    }
  }
  fillBox(0,0x3a,0x80,6,0xff);
  for (local_20 = status_line; *local_20 != '\0'; local_20 = local_20 + 1) {
    drawChar(((int)local_20 + -0x184e70) * 4,0x3a,(int)*local_20 | 0x100);
  }
  return;
}

Assistant:

static void drawMap()
{
    for(int x=0; x<DISPLAY_WIDTH / 4; x++)
    {
        for(int y=0; y<DISPLAY_HEIGHT / 6; y++)
        {
            int n = 0;
            if ((x + map_view_x) >= 0 && (x + map_view_x) < NUMCOLS && (y + map_view_y) >= 0 && (y + map_view_y) < NUMLINES)
                n = map_buffer[(x + map_view_x) + (y + map_view_y) * NUMCOLS];

            drawChar(x*4, y*6, n);
        }
    }
    fillBox(0, DISPLAY_HEIGHT-6, DISPLAY_WIDTH, 6, 255);
    for(char* c=status_line; *c; c++)
    {
        drawChar((c-status_line)*4, DISPLAY_HEIGHT-6, (*c) | DISPLAY_INVERT);
    }
}